

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::PrintServiceDescriptors(Generator *this)

{
  int iVar1;
  long in_RDI;
  int i;
  char *in_stack_00000028;
  Printer *in_stack_00000030;
  ServiceDescriptor *in_stack_00000148;
  Generator *in_stack_00000150;
  ServiceDescriptor *in_stack_00000598;
  Generator *in_stack_000005a0;
  undefined4 local_c;
  
  local_c = 0;
  while( true ) {
    iVar1 = FileDescriptor::service_count(*(FileDescriptor **)(in_RDI + 0x30));
    if (iVar1 <= local_c) break;
    FileDescriptor::service(*(FileDescriptor **)(in_RDI + 0x30),local_c);
    PrintServiceDescriptor(in_stack_000005a0,in_stack_00000598);
    FileDescriptor::service(*(FileDescriptor **)(in_RDI + 0x30),local_c);
    AddServiceToFileDescriptor(in_stack_00000150,in_stack_00000148);
    io::Printer::Print<>(in_stack_00000030,in_stack_00000028);
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void Generator::PrintServiceDescriptors() const {
  for (int i = 0; i < file_->service_count(); ++i) {
    PrintServiceDescriptor(*file_->service(i));
    AddServiceToFileDescriptor(*file_->service(i));
    printer_->Print("\n");
  }
}